

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::stop_election_timer(raft_server *this)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  string local_30;
  
  if ((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar3 = (*peVar2->_vptr_logger[7])();
      if (2 < iVar3) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_30,
                   "Election Timer is never started but is requested to stop, protential a bug");
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"stop_election_timer",0xc1,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p);
        }
      }
    }
  }
  else {
    peVar1 = (this->scheduler_).
             super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      (*peVar1->_vptr_delayed_task_scheduler[3])(peVar1,&this->election_task_);
      LOCK();
      (((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->cancelled_)._M_base._M_i = true;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void raft_server::stop_election_timer() {
    if (!election_task_) {
        p_wn("Election Timer is never started but is "
             "requested to stop, protential a bug");
        return;
    }

    cancel_task(election_task_);
}